

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O3

float __thiscall
deqp::gles2::Functional::VertexCubeTextureCase::calculateLod
          (VertexCubeTextureCase *this,Vec2 *texScale,Vec2 *dstSize,int textureNdx)

{
  uint uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  fVar2 = (float)(this->m_textures[textureNdx]->m_refTexture).m_size;
  auVar3._0_4_ = fVar2 * (float)*(undefined8 *)texScale->m_data;
  auVar3._4_4_ = fVar2 * (float)((ulong)*(undefined8 *)texScale->m_data >> 0x20);
  auVar3._8_4_ = fVar2 * 0.0;
  auVar3._12_4_ = fVar2 * 0.0;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)dstSize->m_data;
  auVar4 = divps(auVar3,auVar4);
  uVar1 = -(uint)(auVar4._4_4_ <= auVar4._0_4_);
  fVar2 = logf((float)(~uVar1 & (uint)auVar4._4_4_ | (uint)auVar4._0_4_ & uVar1));
  return fVar2 * 1.442695;
}

Assistant:

float VertexCubeTextureCase::calculateLod (const Vec2& texScale, const Vec2& dstSize, int textureNdx) const
{
	const tcu::TextureCube&		refTexture	= m_textures[textureNdx]->getRefTexture();
	const Vec2					srcSize		= Vec2((float)refTexture.getSize(), (float)refTexture.getSize());
	const Vec2					sizeRatio	= texScale*srcSize / dstSize;

	// \note In this particular case, dv/dx and du/dy are zero, simplifying the expression.
	return deFloatLog2(de::max(sizeRatio.x(), sizeRatio.y()));
}